

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

void re_print(regex_t *pattern)

{
  uchar uVar1;
  long lVar2;
  long lVar3;
  regex_t *prVar4;
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x200) {
      return;
    }
    if ((ulong)pattern[lVar2].type == 0) break;
    prVar4 = pattern + lVar2;
    printf("type: %s",&DAT_00117844 + *(int *)(&DAT_00117844 + (ulong)pattern[lVar2].type * 4));
    if (prVar4->type - 8 < 2) {
      printf(" [");
      for (lVar3 = 0;
          ((lVar3 != 0x28 && (uVar1 = (prVar4->u).ccl[lVar3], uVar1 != '\0')) && (uVar1 != ']'));
          lVar3 = lVar3 + 1) {
        putchar((int)(char)uVar1);
      }
      putchar(0x5d);
    }
    else if (prVar4->type == 7) {
      printf(" \'%c\'",(ulong)(prVar4->u).ch);
    }
    putchar(10);
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void re_print(regex_t* pattern)
{
  const char* types[] = { "UNUSED", "DOT", "BEGIN", "END", "QUESTIONMARK", "STAR", "PLUS", "RE_CHAR", "CHAR_CLASS", "INV_CHAR_CLASS", "DIGIT", "NOT_DIGIT", "ALPHA", "NOT_ALPHA", "WHITESPACE", "NOT_WHITESPACE", "BRANCH" };

  int i;
  int j;
  char c;
  for (i = 0; i < MAX_REGEXP_OBJECTS; ++i)
  {
    if (pattern[i].type == UNUSED)
    {
      break;
    }

    printf("type: %s", types[pattern[i].type]);
    if (pattern[i].type == CHAR_CLASS || pattern[i].type == INV_CHAR_CLASS)
    {
      printf(" [");
      for (j = 0; j < MAX_CHAR_CLASS_LEN; ++j)
      {
        c = pattern[i].u.ccl[j];
        if ((c == '\0') || (c == ']'))
        {
          break;
        }
        printf("%c", c);
      }
      printf("]");
    }
    else if (pattern[i].type == RE_CHAR)
    {
      printf(" '%c'", pattern[i].u.ch);
    }
    printf("\n");
  }
}